

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O0

double TTA::MemTotalAccesses(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = MemVector<unsigned_int>::GetTotalAccesses(&mem_rtable_);
  dVar2 = MemVector<unsigned_int>::GetTotalAccesses(&mem_next_);
  dVar3 = MemVector<unsigned_int>::GetTotalAccesses(&mem_tail_);
  return dVar1 + dVar2 + dVar3;
}

Assistant:

static double MemTotalAccesses() {
        return mem_rtable_.GetTotalAccesses() +
            mem_next_.GetTotalAccesses() +
            mem_tail_.GetTotalAccesses();
    }